

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_reduceTable_btlazy2(U32 *table,U32 size,U32 reducerValue)

{
  U32 reducerValue_local;
  U32 size_local;
  U32 *table_local;
  U32 newVal;
  int column;
  U32 reducerThreshold;
  int rowNb;
  int cellNb;
  int nbRows;
  
  cellNb = 0;
  for (rowNb = 0; rowNb < (int)size / 0x10; rowNb = rowNb + 1) {
    for (column = 0; column < 0x10; column = column + 1) {
      if (table[cellNb] == 1) {
        newVal = 1;
      }
      else if (table[cellNb] < reducerValue + 2) {
        newVal = 0;
      }
      else {
        newVal = table[cellNb] - reducerValue;
      }
      table[cellNb] = newVal;
      cellNb = cellNb + 1;
    }
  }
  return;
}

Assistant:

static void ZSTD_reduceTable_btlazy2(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 1);
}